

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::gt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)uVar1 == 5) {
    if ((uVar1 != 5) || ((other->type).id != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x131,"double wasm::Literal::getf64() const");
    }
    bVar3 = *(double *)&this->field_0 == *(double *)&other->field_0;
    bVar2 = *(double *)&this->field_0 < *(double *)&other->field_0;
  }
  else {
    if ((int)uVar1 != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x624);
    }
    if ((uVar1 != 4) || ((other->type).id != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x12d,"float wasm::Literal::getf32() const");
    }
    bVar3 = *(float *)&this->field_0 == *(float *)&other->field_0;
    bVar2 = *(float *)&this->field_0 < *(float *)&other->field_0;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(!bVar2 && !bVar3);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::gt(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(getf32() > other.getf32());
    case Type::f64:
      return Literal(getf64() > other.getf64());
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}